

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

ostream * tcb::operator<<(ostream *os,rational<unsigned_int> *r)

{
  ostream *poVar1;
  
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  if (r->denom_ != 1) {
    poVar1 = std::operator<<(os,'/');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}